

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveResourceSignatures
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  PipelineStateBase<Diligent::EngineVkImplTraits> *pPVar1;
  byte bVar2;
  PipelineResourceSignatureVkImpl *pPVar3;
  uint uVar4;
  char (*in_RCX) [86];
  char (*in_R8) [82];
  uint uVar5;
  string msg;
  char (*in_stack_ffffffffffffff88) [78];
  uint local_6c;
  string local_68;
  char local_48 [4];
  uint local_44;
  FixedLinearAllocator *local_40;
  PipelineStateBase<Diligent::EngineVkImplTraits> *local_38;
  
  if ((this->m_UsingImplicitSignature == true) &&
     (((byte *)CreateInfo->pInternalData == (byte *)0x0 || ((*CreateInfo->pInternalData & 1) == 0)))
     ) {
    if ((CreateInfo->ResourceSignaturesCount != 0) &&
       (CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[86]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr"
                 ,in_RCX);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4db);
      std::__cxx11::string::~string((string *)&local_68);
    }
    this->m_SignatureCount = '\x01';
    bVar2 = 1;
  }
  else {
    if ((CreateInfo->ResourceSignaturesCount == 0) ||
       (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[85]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr"
                 ,(char (*) [85])in_RCX);
      in_RCX = (char (*) [86])0x4e0;
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4e0);
      std::__cxx11::string::~string((string *)&local_68);
    }
    uVar5 = 0;
    local_40 = MemPool;
    local_38 = this;
    for (local_6c = 0; pPVar1 = local_38, local_6c < CreateInfo->ResourceSignaturesCount;
        local_6c = local_6c + 1) {
      in_RCX = (char (*) [86])CreateInfo->ppResourceSignatures;
      pPVar3 = ClassPtrCast<Diligent::PipelineResourceSignatureVkImpl,Diligent::IPipelineResourceSignature>
                         (*(IPipelineResourceSignature **)(*in_RCX + (ulong)local_6c * 8));
      if (pPVar3 == (PipelineResourceSignatureVkImpl *)0x0) {
        FormatString<char[38],unsigned_int,char[82]>
                  (&local_68,(Diligent *)"Pipeline resource signature at index ",
                   (char (*) [38])&local_6c,
                   (uint *)
                   " is null. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                   ,in_R8);
        in_RCX = (char (*) [86])0x4e5;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4e5);
        std::__cxx11::string::~string((string *)&local_68);
      }
      bVar2 = (pPVar3->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              .m_Desc.BindingIndex;
      if (7 < bVar2) {
        local_48[0] = '\a';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        in_R8 = (char (*) [82])local_48;
        local_44 = (uint)bVar2;
        FormatString<char[53],unsigned_int,char[26],unsigned_int,char[78]>
                  (&local_68,(Diligent *)"Pipeline resource signature specifies binding index ",
                   (char (*) [53])&local_44,(uint *)" that exceeds the limit (",(char (*) [26])in_R8
                   ,(uint *)
                    "). This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                   ,in_stack_ffffffffffffff88);
        in_RCX = (char (*) [86])0x4ea;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4ea);
        std::__cxx11::string::~string((string *)&local_68);
      }
      if (uVar5 <= bVar2) {
        uVar5 = (uint)bVar2;
      }
    }
    if (7 < uVar5) {
      FormatString<char[26],char[51]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES",
                 (char (*) [51])in_RCX);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4ee);
      std::__cxx11::string::~string((string *)&local_68);
    }
    MemPool = local_40;
    bVar2 = (byte)(uVar5 + 1);
    pPVar1->m_SignatureCount = bVar2;
    uVar4 = uVar5 + 1 & 0xff;
    if (uVar5 + 1 != uVar4) {
      FormatString<char[26],char[49]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_SignatureCount == MaxSignatureBindingIndex + 1",
                 (char (*) [49])(ulong)uVar4);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4f0);
      std::__cxx11::string::~string((string *)&local_68);
      bVar2 = pPVar1->m_SignatureCount;
    }
  }
  FixedLinearAllocator::AddSpace<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>>
            (MemPool,(ulong)bVar2);
  return;
}

Assistant:

void ReserveResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        if (m_UsingImplicitSignature && (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr);
            m_SignatureCount = 1;
        }
        else
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr);
            Uint32 MaxSignatureBindingIndex = 0;
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                const PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY(pSignature != nullptr, "Pipeline resource signature at index ", i, " is null. This error should've been caught by ValidatePipelineResourceSignatures.");

                Uint32 Index = pSignature->GetDesc().BindingIndex;
                VERIFY(Index < MAX_RESOURCE_SIGNATURES,
                       "Pipeline resource signature specifies binding index ", Uint32{Index}, " that exceeds the limit (", MAX_RESOURCE_SIGNATURES - 1,
                       "). This error should've been caught by ValidatePipelineResourceSignatureDesc.");

                MaxSignatureBindingIndex = std::max(MaxSignatureBindingIndex, Uint32{Index});
            }
            VERIFY_EXPR(MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES);
            m_SignatureCount = static_cast<decltype(m_SignatureCount)>(MaxSignatureBindingIndex + 1);
            VERIFY_EXPR(m_SignatureCount == MaxSignatureBindingIndex + 1);
        }

        MemPool.AddSpace<SignatureAutoPtrType>(m_SignatureCount);
    }